

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd_ext_to_khr.cpp
# Opt level: O2

bool spvtools::opt::anon_unknown_7::ReplaceMbcnt
               (IRContext *context,Instruction *inst,
               vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
               *param_3)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t id;
  uint32_t uVar3;
  int iVar4;
  TypeManager *this;
  DefUseManager *this_00;
  Instruction *pIVar5;
  TypeManager *pTVar6;
  Type *pTVar7;
  Instruction *this_01;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  initializer_list<unsigned_int> init_list;
  uint32_t local_fc;
  undefined8 local_f8;
  SmallVector<unsigned_int,_2UL> SStack_f0;
  SmallVector<unsigned_int,_2UL> local_c8;
  Vector temp_type;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  InstructionBuilder ir_builder;
  
  this = IRContext::get_type_mgr(context);
  this_00 = IRContext::get_def_use_mgr(context);
  uVar1 = IRContext::GetBuiltinInputVarId(context,0x1144);
  if (uVar1 == 0) {
    __assert_fail("var_id != 0 && \"Could not get SubgroupLtMask variable.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/amd_ext_to_khr.cpp"
                  ,0x1e8,
                  "bool spvtools::opt::(anonymous namespace)::ReplaceMbcnt(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &)"
                 );
  }
  IRContext::AddCapability(context,GroupNonUniformBallot);
  pIVar5 = analysis::DefUseManager::GetDef(this_00,uVar1);
  uVar2 = Instruction::type_id(pIVar5);
  pIVar5 = analysis::DefUseManager::GetDef(this_00,uVar2);
  uVar2 = Instruction::GetSingleWordInOperand(pIVar5,1);
  pIVar5 = analysis::DefUseManager::GetDef(this_00,uVar2);
  if (pIVar5->opcode_ != OpTypeVector) {
    __assert_fail("var_type->opcode() == spv::Op::OpTypeVector && \"Variable is suppose to be a vector of 4 ints\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/amd_ext_to_khr.cpp"
                  ,0x1ef,
                  "bool spvtools::opt::(anonymous namespace)::ReplaceMbcnt(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &)"
                 );
  }
  temp_type.super_Type.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  temp_type.super_Type.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  temp_type.super_Type.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  temp_type.super_Type.kind_ = kInteger;
  temp_type.super_Type._36_4_ = 0x20;
  temp_type.super_Type._vptr_Type = (_func_int **)&PTR__Type_003b18d0;
  temp_type.element_type_._0_1_ = 0;
  pTVar6 = IRContext::get_type_mgr(context);
  pTVar7 = analysis::TypeManager::GetRegisteredType(pTVar6,&temp_type.super_Type);
  analysis::Type::~Type(&temp_type.super_Type);
  analysis::Vector::Vector(&temp_type,pTVar7,2);
  pTVar6 = IRContext::get_type_mgr(context);
  pTVar7 = analysis::TypeManager::GetRegisteredType(pTVar6,&temp_type.super_Type);
  uVar2 = analysis::TypeManager::GetTypeInstruction(this,pTVar7);
  id = Instruction::GetSingleWordInOperand(inst,2);
  this_01 = analysis::DefUseManager::GetDef(this_00,id);
  uVar3 = Instruction::type_id(this_01);
  pTVar7 = analysis::TypeManager::GetType(this,uVar3);
  iVar4 = (*pTVar7->_vptr_Type[9])(pTVar7);
  if (CONCAT44(extraout_var,iVar4) == 0) {
    __assert_fail("type_mgr->GetType(mask_inst->type_id())->AsInteger() != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/amd_ext_to_khr.cpp"
                  ,0x1fb,
                  "bool spvtools::opt::(anonymous namespace)::ReplaceMbcnt(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &)"
                 );
  }
  uVar3 = Instruction::type_id(this_01);
  pTVar7 = analysis::TypeManager::GetType(this,uVar3);
  iVar4 = (*pTVar7->_vptr_Type[9])(pTVar7);
  if (*(int *)(CONCAT44(extraout_var_00,iVar4) + 0x24) == 0x40) {
    InstructionBuilder::InstructionBuilder
              (&ir_builder,context,inst,kAnalysisInstrToBlockMapping|kAnalysisBegin);
    uVar3 = Instruction::result_id(pIVar5);
    pIVar5 = InstructionBuilder::AddLoad(&ir_builder,uVar3,uVar1,0);
    uVar1 = Instruction::result_id(pIVar5);
    uVar3 = Instruction::result_id(pIVar5);
    local_c8._vptr_SmallVector = (_func_int **)0x100000000;
    local_f8 = 0;
    SStack_f0._vptr_SmallVector = (_func_int **)0x0;
    SStack_f0.size_ = 0;
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_range_initialize<unsigned_int_const*>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_f8,&local_c8);
    pIVar5 = InstructionBuilder::AddVectorShuffle
                       (&ir_builder,uVar2,uVar1,uVar3,
                        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_f8);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_f8);
    uVar1 = Instruction::type_id(this_01);
    uVar2 = Instruction::result_id(pIVar5);
    pIVar5 = InstructionBuilder::AddUnaryOp(&ir_builder,uVar1,OpBitcast,uVar2);
    uVar1 = Instruction::type_id(this_01);
    uVar2 = Instruction::result_id(pIVar5);
    pIVar5 = InstructionBuilder::AddBinaryOp(&ir_builder,uVar1,OpBitwiseAnd,uVar2,id);
    inst->opcode_ = OpBitCount;
    local_fc = Instruction::result_id(pIVar5);
    init_list._M_len = 1;
    init_list._M_array = &local_fc;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_c8,init_list);
    local_f8 = CONCAT44(local_f8._4_4_,1);
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&SStack_f0,&local_c8);
    local_68 = 0;
    uStack_60 = 0;
    local_58 = 0;
    std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
    _M_range_initialize<spvtools::opt::Operand_const*>
              ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_68,
               &local_f8,&local_c8);
    Instruction::SetInOperands(inst,(OperandList *)&local_68);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&local_68)
    ;
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&SStack_f0);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_c8);
    IRContext::UpdateDefUse(context,inst);
    analysis::Type::~Type(&temp_type.super_Type);
    return true;
  }
  __assert_fail("type_mgr->GetType(mask_inst->type_id())->AsInteger()->width() == 64",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/amd_ext_to_khr.cpp"
                ,0x1fc,
                "bool spvtools::opt::(anonymous namespace)::ReplaceMbcnt(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &)"
               );
}

Assistant:

bool ReplaceMbcnt(IRContext* context, Instruction* inst,
                  const std::vector<const analysis::Constant*>&) {
  analysis::TypeManager* type_mgr = context->get_type_mgr();
  analysis::DefUseManager* def_use_mgr = context->get_def_use_mgr();

  uint32_t var_id =
      context->GetBuiltinInputVarId(uint32_t(spv::BuiltIn::SubgroupLtMask));
  assert(var_id != 0 && "Could not get SubgroupLtMask variable.");
  context->AddCapability(spv::Capability::GroupNonUniformBallot);
  Instruction* var_inst = def_use_mgr->GetDef(var_id);
  Instruction* var_ptr_type = def_use_mgr->GetDef(var_inst->type_id());
  Instruction* var_type =
      def_use_mgr->GetDef(var_ptr_type->GetSingleWordInOperand(1));
  assert(var_type->opcode() == spv::Op::OpTypeVector &&
         "Variable is suppose to be a vector of 4 ints");

  // Get the type for the shuffle.
  analysis::Vector temp_type(GetUIntType(context), 2);
  const analysis::Type* shuffle_type =
      context->get_type_mgr()->GetRegisteredType(&temp_type);
  uint32_t shuffle_type_id = type_mgr->GetTypeInstruction(shuffle_type);

  uint32_t mask_id = inst->GetSingleWordInOperand(2);
  Instruction* mask_inst = def_use_mgr->GetDef(mask_id);

  // Testing with amd's shader compiler shows that a 64-bit mask is expected.
  assert(type_mgr->GetType(mask_inst->type_id())->AsInteger() != nullptr);
  assert(type_mgr->GetType(mask_inst->type_id())->AsInteger()->width() == 64);

  InstructionBuilder ir_builder(
      context, inst,
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);
  Instruction* load = ir_builder.AddLoad(var_type->result_id(), var_id);
  Instruction* shuffle = ir_builder.AddVectorShuffle(
      shuffle_type_id, load->result_id(), load->result_id(), {0, 1});
  Instruction* bitcast = ir_builder.AddUnaryOp(
      mask_inst->type_id(), spv::Op::OpBitcast, shuffle->result_id());
  Instruction* t =
      ir_builder.AddBinaryOp(mask_inst->type_id(), spv::Op::OpBitwiseAnd,
                             bitcast->result_id(), mask_id);

  inst->SetOpcode(spv::Op::OpBitCount);
  inst->SetInOperands({{SPV_OPERAND_TYPE_ID, {t->result_id()}}});
  context->UpdateDefUse(inst);
  return true;
}